

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O2

void ShowLine(int i)

{
  char *__format;
  
  if (i < 10000) {
    if (i < 1000) {
      if (i < 100) {
        __format = "%1d\b";
        if (9 < i) {
          __format = "%2d\b\b";
        }
      }
      else {
        __format = "%3d\b\b\b";
      }
    }
    else {
      __format = "%4d\b\b\b\b";
    }
  }
  else {
    __format = "%5d\b\b\b\b\b";
  }
  printf(__format);
  fflush(_stdout);
  return;
}

Assistant:

void ShowLine(int i)
/* Shows the current line number and backs up over it. */
{
	if (i >= 10000)
		printf("%5d\b\b\b\b\b", i);
	else if (i >= 1000)
		printf("%4d\b\b\b\b", i);
	else if (i >= 100)
		printf("%3d\b\b\b", i);
	else if (i >= 10)
		printf("%2d\b\b", i);
	else
		printf("%1d\b", i);
	fflush(stdout); /* Make sure it gets out. */
}